

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O0

int ngp_keyword_is_write(NGP_TOKEN *ngp_tok)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int spc;
  int l;
  int j;
  int i;
  NGP_TOKEN *ngp_tok_local;
  
  if (ngp_tok == (NGP_TOKEN *)0x0) {
    return 0x16a;
  }
  for (spc = 0; ngp_keyword_is_write::nmni[spc] != (char *)0x0; spc = spc + 1) {
    iVar2 = strcmp(ngp_keyword_is_write::nmni[spc],ngp_tok->name);
    if (iVar2 == 0) {
      return 0x170;
    }
  }
  spc = 0;
  while( true ) {
    if (ngp_keyword_is_write::nm[spc] == (char *)0x0) {
      return 0;
    }
    sVar3 = strlen(ngp_keyword_is_write::nm[spc]);
    l = (int)sVar3;
    if (((0 < l) && (l < 6)) &&
       (iVar2 = strncmp(ngp_keyword_is_write::nm[spc],ngp_tok->name,(long)l), iVar2 == 0)) break;
    spc = spc + 1;
  }
  if (('0' < ngp_tok->name[l]) && (ngp_tok->name[l] < ':')) {
    bVar1 = false;
    do {
      while( true ) {
        l = l + 1;
        if (7 < l) {
          return 0x170;
        }
        if (bVar1) break;
        if ((ngp_tok->name[l] < '0') || ('9' < ngp_tok->name[l])) {
          if (ngp_tok->name[l] != ' ') {
            if (ngp_tok->name[l] == '\0') {
              return 0x170;
            }
            return 0;
          }
          bVar1 = true;
        }
      }
    } while (ngp_tok->name[l] == ' ');
    return 0;
  }
  return 0;
}

Assistant:

int	ngp_keyword_is_write(NGP_TOKEN *ngp_tok)
 { int i, j, l, spc;
                        /* indexed variables not to write */

   static char *nm[] = { "NAXIS", "TFORM", "TTYPE", NULL } ;

                        /* non indexed variables not allowed to write */
  
   static char *nmni[] = { "SIMPLE", "XTENSION", "BITPIX", "NAXIS", "PCOUNT",
                           "GCOUNT", "TFIELDS", "THEAP", "EXTEND", "EXTVER",
                           NULL } ;

   if (NULL == ngp_tok) return(NGP_NUL_PTR);

   for (j = 0; ; j++)           /* first check non indexed */
    { if (NULL == nmni[j]) break;
      if (0 == strcmp(nmni[j], ngp_tok->name)) return(NGP_BAD_ARG);
    } 

   for (j = 0; ; j++)           /* now check indexed */
    { if (NULL == nm[j]) return(NGP_OK);
      l = strlen(nm[j]);
      if ((l < 1) || (l > 5)) continue;
      if (0 == strncmp(nm[j], ngp_tok->name, l)) break;
    } 

   if ((ngp_tok->name[l] < '1') || (ngp_tok->name[l] > '9')) return(NGP_OK);
   spc = 0;
   for (i = l + 1; i < 8; i++)
    { if (spc) { if (' ' != ngp_tok->name[i]) return(NGP_OK); }
      else
       { if ((ngp_tok->name[i] >= '0') && (ngp_tok->name[i] <= '9')) continue;
         if (' ' == ngp_tok->name[i]) { spc = 1; continue; }
         if (0 == ngp_tok->name[i]) break;
         return(NGP_OK);
       }
    }
   return(NGP_BAD_ARG);
 }